

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_get_b32(uchar *r,secp256k1_fe *a)

{
  int iVar1;
  secp256k1_pubkey *in_RCX;
  long lVar2;
  secp256k1_fe *extraout_RDX;
  secp256k1_fe *pubkey;
  int *extraout_RDX_00;
  bool bVar3;
  secp256k1_context *ctx;
  uchar *output32;
  bool bVar4;
  secp256k1_ge sStack_f8;
  uchar *puStack_90;
  secp256k1_fe *psStack_88;
  uchar auStack_80 [32];
  uchar auStack_60 [32];
  uchar *puStack_40;
  
  pubkey = a;
  ctx = (secp256k1_context *)a;
  secp256k1_fe_verify(a);
  if (a->normalized != 0) {
    *r = *(uchar *)((long)a->n + 0x25);
    r[1] = *(uchar *)((long)a->n + 0x24);
    r[2] = *(uchar *)((long)a->n + 0x23);
    r[3] = *(uchar *)((long)a->n + 0x22);
    r[4] = *(uchar *)((long)a->n + 0x21);
    r[5] = (uchar)a->n[4];
    r[6] = (uchar)(a->n[3] >> 0x2c);
    r[7] = (uchar)(a->n[3] >> 0x24);
    r[8] = (uchar)(a->n[3] >> 0x1c);
    r[9] = (uchar)((uint)a->n[3] >> 0x14);
    r[10] = (uchar)((uint)a->n[3] >> 0xc);
    r[0xb] = (uchar)((uint)a->n[3] >> 4);
    r[0xc] = (byte)((int)a->n[3] << 4) | (byte)*(undefined2 *)((long)a->n + 0x16) & 0xf;
    r[0xd] = *(uchar *)((long)a->n + 0x15);
    r[0xe] = *(uchar *)((long)a->n + 0x14);
    r[0xf] = *(uchar *)((long)a->n + 0x13);
    r[0x10] = *(uchar *)((long)a->n + 0x12);
    r[0x11] = *(uchar *)((long)a->n + 0x11);
    r[0x12] = (uchar)a->n[2];
    r[0x13] = (uchar)(a->n[1] >> 0x2c);
    r[0x14] = (uchar)(a->n[1] >> 0x24);
    r[0x15] = (uchar)(a->n[1] >> 0x1c);
    r[0x16] = (uchar)((uint)a->n[1] >> 0x14);
    r[0x17] = (uchar)((uint)a->n[1] >> 0xc);
    r[0x18] = (uchar)((uint)a->n[1] >> 4);
    r[0x19] = (byte)((int)a->n[1] << 4) | (byte)*(undefined2 *)((long)a->n + 6) & 0xf;
    r[0x1a] = *(uchar *)((long)a->n + 5);
    r[0x1b] = *(uchar *)((long)a->n + 4);
    r[0x1c] = *(uchar *)((long)a->n + 3);
    r[0x1d] = *(uchar *)((long)a->n + 2);
    r[0x1e] = *(uchar *)((long)a->n + 1);
    r[0x1f] = (uchar)a->n[0];
    return;
  }
  secp256k1_fe_get_b32_cold_1();
  puStack_40 = r;
  if (ctx != (secp256k1_context *)0x0) {
    output32 = auStack_80;
    bVar4 = true;
    do {
      bVar3 = bVar4;
      psStack_88 = (secp256k1_fe *)0x11f019;
      iVar1 = secp256k1_xonly_pubkey_serialize(ctx,output32,(secp256k1_xonly_pubkey *)pubkey);
      if (iVar1 == 0) {
        output32[0x10] = '\0';
        output32[0x11] = '\0';
        output32[0x12] = '\0';
        output32[0x13] = '\0';
        output32[0x14] = '\0';
        output32[0x15] = '\0';
        output32[0x16] = '\0';
        output32[0x17] = '\0';
        output32[0x18] = '\0';
        output32[0x19] = '\0';
        output32[0x1a] = '\0';
        output32[0x1b] = '\0';
        output32[0x1c] = '\0';
        output32[0x1d] = '\0';
        output32[0x1e] = '\0';
        output32[0x1f] = '\0';
        output32[0] = '\0';
        output32[1] = '\0';
        output32[2] = '\0';
        output32[3] = '\0';
        output32[4] = '\0';
        output32[5] = '\0';
        output32[6] = '\0';
        output32[7] = '\0';
        output32[8] = '\0';
        output32[9] = '\0';
        output32[10] = '\0';
        output32[0xb] = '\0';
        output32[0xc] = '\0';
        output32[0xd] = '\0';
        output32[0xe] = '\0';
        output32[0xf] = '\0';
      }
      pubkey = extraout_RDX;
      output32 = auStack_60;
      bVar4 = false;
    } while (bVar3);
    lVar2 = 0x20;
    do {
      if (*(uchar *)((long)sStack_f8.y.n + lVar2 + 0x28) != auStack_80[lVar2]) {
        return;
      }
      bVar4 = lVar2 != 0x3f;
      lVar2 = lVar2 + 1;
    } while (bVar4);
    return;
  }
  psStack_88 = (secp256k1_fe *)secp256k1_xonly_pubkey_from_pubkey;
  secp256k1_xonly_pubkey_cmp_cold_1();
  puStack_90 = r;
  psStack_88 = a;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_xonly_pubkey_from_pubkey_cold_3();
  }
  else if (pubkey != (secp256k1_fe *)0x0) {
    if (in_RCX == (secp256k1_pubkey *)0x0) {
      secp256k1_xonly_pubkey_from_pubkey_cold_1();
      return;
    }
    iVar1 = secp256k1_pubkey_load(ctx,&sStack_f8,in_RCX);
    if (iVar1 == 0) {
      return;
    }
    iVar1 = secp256k1_extrakeys_ge_even_y(&sStack_f8);
    if (extraout_RDX_00 != (int *)0x0) {
      *extraout_RDX_00 = iVar1;
    }
    secp256k1_ge_to_bytes((uchar *)pubkey,&sStack_f8);
    return;
  }
  secp256k1_xonly_pubkey_from_pubkey_cold_2();
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_get_b32(unsigned char *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(a);
    VERIFY_CHECK(a->normalized);

    secp256k1_fe_impl_get_b32(r, a);
}